

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

DdNode * extraBddAndPermute(DdHashTable *table,DdManager *ddF,DdNode *bF,DdManager *ddG,DdNode *bG,
                           int *pPermute)

{
  int *piVar1;
  DdNode *f;
  int iVar2;
  abctime aVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  DdNode *pDVar8;
  ulong uVar9;
  DdNode *pDVar10;
  uint *puVar11;
  DdNode *pDVar12;
  DdNode *bG_00;
  
  pDVar12 = (DdNode *)((ulong)ddF->one ^ 1);
  if ((((pDVar12 != bF) && ((DdNode *)((ulong)ddG->one ^ 1) != bG)) &&
      (pDVar12 = bF, ddG->one != bG)) &&
     (pDVar12 = cuddHashTableLookup2(table,bF,bG), pDVar12 == (DdNode *)0x0)) {
    Counter = Counter + 1;
    if (((ddF->TimeStop == 0) || (aVar3 = Abc_Clock(), aVar3 <= ddF->TimeStop)) &&
       ((ddG->TimeStop == 0 || (aVar3 = Abc_Clock(), aVar3 <= ddG->TimeStop)))) {
      puVar7 = (uint *)((ulong)bF & 0xfffffffffffffffe);
      iVar2 = 0x7fffffff;
      if ((ulong)*puVar7 != 0x7fffffff) {
        iVar2 = ddF->perm[*puVar7];
      }
      puVar11 = (uint *)((ulong)bG & 0xfffffffffffffffe);
      if (pPermute == (int *)0x0) {
        uVar5 = *puVar11;
      }
      else {
        uVar5 = pPermute[*puVar11];
      }
      iVar4 = 0x7fffffff;
      if (uVar5 != 0x7fffffff) {
        iVar4 = ddF->perm[uVar5];
      }
      iVar6 = iVar4;
      if (iVar2 < iVar4) {
        iVar6 = iVar2;
      }
      if (ddF->size <= iVar6) {
        __assert_fail("Lev < ddF->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddMisc.c"
                      ,0x88e,
                      "DdNode *extraBddAndPermute(DdHashTable *, DdManager *, DdNode *, DdManager *, DdNode *, int *)"
                     );
      }
      pDVar12 = bF;
      pDVar10 = bF;
      if (iVar2 <= iVar4) {
        uVar9 = (ulong)((uint)bF & 1);
        pDVar12 = (DdNode *)(*(ulong *)(puVar7 + 6) ^ uVar9);
        pDVar10 = (DdNode *)(uVar9 ^ *(ulong *)(puVar7 + 4));
      }
      pDVar8 = bG;
      bG_00 = bG;
      if (iVar4 <= iVar2) {
        uVar9 = (ulong)((uint)bG & 1);
        pDVar8 = (DdNode *)(*(ulong *)(puVar11 + 6) ^ uVar9);
        bG_00 = (DdNode *)(uVar9 ^ *(ulong *)(puVar11 + 4));
      }
      f = ddF->vars[ddF->invperm[iVar6]];
      pDVar12 = extraBddAndPermute(table,ddF,pDVar12,ddG,pDVar8,pPermute);
      if (pDVar12 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar12 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar10 = extraBddAndPermute(table,ddF,pDVar10,ddG,bG_00,pPermute);
        if (pDVar10 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar8 = cuddBddIteRecur(ddF,f,pDVar10,pDVar12);
          if (pDVar8 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_IterDerefBdd(ddF,pDVar12);
            Cudd_IterDerefBdd(ddF,pDVar10);
            cuddHashTableInsert2(table,bF,bG,pDVar8,(ulong)puVar11[1] * (ulong)puVar7[1] + -1);
            piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            return pDVar8;
          }
          Cudd_IterDerefBdd(ddF,pDVar12);
          pDVar12 = pDVar10;
        }
        Cudd_IterDerefBdd(ddF,pDVar12);
      }
    }
    pDVar12 = (DdNode *)0x0;
  }
  return pDVar12;
}

Assistant:

DdNode * extraBddAndPermute( DdHashTable * table, DdManager * ddF, DdNode * bF, DdManager * ddG, DdNode * bG, int * pPermute )
{
    DdNode * bF0, * bF1, * bG0, * bG1, * bRes0, * bRes1, * bRes, * bVar;
    int LevF, LevG, Lev;

    // if F == 0, return 0 
    if ( bF == Cudd_Not(ddF->one) )
        return Cudd_Not(ddF->one);
    // if G == 0, return 0 
    if ( bG == Cudd_Not(ddG->one) )
        return Cudd_Not(ddF->one);
    // if G == 1, return F
    if ( bG == ddG->one )
        return bF;
    // cannot use F == 1, because the var order of G has to be changed

    // check cache
    if ( //(Cudd_Regular(bF)->ref != 1 || Cudd_Regular(bG)->ref != 1) && 
         (bRes = cuddHashTableLookup2(table, bF, bG)) )
        return bRes;
    Counter++;

    if ( ddF->TimeStop && Abc_Clock() > ddF->TimeStop )
        return NULL;
    if ( ddG->TimeStop && Abc_Clock() > ddG->TimeStop )
        return NULL;

    // find the topmost variable in F and G using var order of F
    LevF = cuddI( ddF, Cudd_Regular(bF)->index );
    LevG = cuddI( ddF, pPermute ? pPermute[Cudd_Regular(bG)->index] : Cudd_Regular(bG)->index );
    Lev  = Abc_MinInt( LevF, LevG );
    assert( Lev < ddF->size );
    bVar = ddF->vars[ddF->invperm[Lev]];

    // cofactor
    bF0 = (Lev < LevF) ? bF : Cudd_NotCond( cuddE(Cudd_Regular(bF)), Cudd_IsComplement(bF) );
    bF1 = (Lev < LevF) ? bF : Cudd_NotCond( cuddT(Cudd_Regular(bF)), Cudd_IsComplement(bF) );
    bG0 = (Lev < LevG) ? bG : Cudd_NotCond( cuddE(Cudd_Regular(bG)), Cudd_IsComplement(bG) );
    bG1 = (Lev < LevG) ? bG : Cudd_NotCond( cuddT(Cudd_Regular(bG)), Cudd_IsComplement(bG) );

    // call for cofactors
    bRes0 = extraBddAndPermute( table, ddF, bF0, ddG, bG0, pPermute );
    if ( bRes0 == NULL ) 
        return NULL;
    cuddRef( bRes0 );
    // call for cofactors
    bRes1 = extraBddAndPermute( table, ddF, bF1, ddG, bG1, pPermute );
    if ( bRes1 == NULL ) 
    {
        Cudd_IterDerefBdd( ddF, bRes0 );
        return NULL;
    }
    cuddRef( bRes1 );

    // compose the result
    bRes = cuddBddIteRecur( ddF, bVar, bRes1, bRes0 );
    if ( bRes == NULL )
    {
        Cudd_IterDerefBdd( ddF, bRes0 );
        Cudd_IterDerefBdd( ddF, bRes1 );
        return NULL;
    }
    cuddRef( bRes );
    Cudd_IterDerefBdd( ddF, bRes0 );
    Cudd_IterDerefBdd( ddF, bRes1 );

    // cache the result
//    if ( Cudd_Regular(bF)->ref != 1 || Cudd_Regular(bG)->ref != 1 )
    {
        ptrint fanout = (ptrint)Cudd_Regular(bF)->ref * Cudd_Regular(bG)->ref;
        cuddSatDec(fanout);
        cuddHashTableInsert2( table, bF, bG, bRes, fanout );
    }
    cuddDeref( bRes );
    return bRes;
}